

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextElement.cpp
# Opt level: O0

TextElement * __thiscall ninx::parser::element::TextElement::clone_impl(TextElement *this)

{
  TextElement *this_00;
  TextElement *this_local;
  
  this_00 = (TextElement *)operator_new(0x38);
  TextElement(this_00,&this->text);
  return this_00;
}

Assistant:

ninx::parser::element::TextElement* ninx::parser::element::TextElement::clone_impl() {
    return new TextElement(this->text);
}